

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict_manager.cpp
# Opt level: O1

void __thiscall
duckdb::ConflictManager::AddIndex
          (ConflictManager *this,BoundIndex *index,
          optional_ptr<duckdb::BoundIndex,_true> delete_index)

{
  pointer *pprVar1;
  pointer *ppoVar2;
  iterator __position;
  iterator __position_00;
  __hashtable *__h;
  __node_gen_type __node_gen;
  reference_wrapper<duckdb::BoundIndex> local_20;
  optional_ptr<duckdb::BoundIndex,_true> local_18;
  
  __position._M_current =
       (this->matched_indexes).
       super_vector<std::reference_wrapper<duckdb::BoundIndex>,_std::allocator<std::reference_wrapper<duckdb::BoundIndex>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::BoundIndex>,_std::allocator<std::reference_wrapper<duckdb::BoundIndex>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_20._M_data = index;
  local_18.ptr = delete_index.ptr;
  if (__position._M_current ==
      (this->matched_indexes).
      super_vector<std::reference_wrapper<duckdb::BoundIndex>,_std::allocator<std::reference_wrapper<duckdb::BoundIndex>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::BoundIndex>,_std::allocator<std::reference_wrapper<duckdb::BoundIndex>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    ::std::
    vector<std::reference_wrapper<duckdb::BoundIndex>,std::allocator<std::reference_wrapper<duckdb::BoundIndex>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::BoundIndex>>
              ((vector<std::reference_wrapper<duckdb::BoundIndex>,std::allocator<std::reference_wrapper<duckdb::BoundIndex>>>
                *)&this->matched_indexes,__position,&local_20);
  }
  else {
    (__position._M_current)->_M_data = index;
    pprVar1 = &(this->matched_indexes).
               super_vector<std::reference_wrapper<duckdb::BoundIndex>,_std::allocator<std::reference_wrapper<duckdb::BoundIndex>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::BoundIndex>,_std::allocator<std::reference_wrapper<duckdb::BoundIndex>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + 1;
  }
  __position_00._M_current =
       (this->matched_delete_indexes).
       super_vector<duckdb::optional_ptr<duckdb::BoundIndex,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BoundIndex,_true>_>_>
       .
       super__Vector_base<duckdb::optional_ptr<duckdb::BoundIndex,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BoundIndex,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->matched_delete_indexes).
      super_vector<duckdb::optional_ptr<duckdb::BoundIndex,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BoundIndex,_true>_>_>
      .
      super__Vector_base<duckdb::optional_ptr<duckdb::BoundIndex,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BoundIndex,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    ::std::
    vector<duckdb::optional_ptr<duckdb::BoundIndex,true>,std::allocator<duckdb::optional_ptr<duckdb::BoundIndex,true>>>
    ::_M_realloc_insert<duckdb::optional_ptr<duckdb::BoundIndex,true>const&>
              ((vector<duckdb::optional_ptr<duckdb::BoundIndex,true>,std::allocator<duckdb::optional_ptr<duckdb::BoundIndex,true>>>
                *)&this->matched_delete_indexes,__position_00,&local_18);
  }
  else {
    (__position_00._M_current)->ptr = local_18.ptr;
    ppoVar2 = &(this->matched_delete_indexes).
               super_vector<duckdb::optional_ptr<duckdb::BoundIndex,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BoundIndex,_true>_>_>
               .
               super__Vector_base<duckdb::optional_ptr<duckdb::BoundIndex,_true>,_std::allocator<duckdb::optional_ptr<duckdb::BoundIndex,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppoVar2 = *ppoVar2 + 1;
  }
  local_20._M_data = (BoundIndex *)&this->matched_index_names;
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_20._M_data,&index->name);
  return;
}

Assistant:

void ConflictManager::AddIndex(BoundIndex &index, optional_ptr<BoundIndex> delete_index) {
	matched_indexes.push_back(index);
	matched_delete_indexes.push_back(delete_index);
	matched_index_names.insert(index.name);
}